

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::~HashTable
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this)

{
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *buffer;
  ulong uVar3;
  
  if (this->tableSize != 0) {
    uVar3 = 0;
    do {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      pSVar1 = this->table + uVar3;
      buffer = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               this->table[uVar3].super_SListNodeBase<Memory::ArenaAllocator>.next;
      while (buffer != pSVar1) {
        pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                 (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (this_00,buffer,0x20);
        buffer = pSVar2;
      }
      (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
           &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
      (pSVar1->super_RealCount).count = 0;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->tableSize);
  }
  return;
}

Assistant:

~HashTable()
    {
        for (uint i = 0; i< tableSize; i++)
        {
            table[i].Clear(alloc);
        }
    }